

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::JunitReporter::JunitReporter(JunitReporter *this,ReporterConfig *config)

{
  undefined8 *in_RDI;
  ReporterConfig *in_stack_ffffffffffffff78;
  Stats *in_stack_ffffffffffffff80;
  allocator local_41;
  string local_40 [64];
  
  SharedImpl<Catch::IReporter>::SharedImpl
            ((SharedImpl<Catch::IReporter> *)in_stack_ffffffffffffff80);
  *in_RDI = &PTR__JunitReporter_0021ef78;
  ReporterConfig::ReporterConfig
            ((ReporterConfig *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"AllTests",&local_41);
  Stats::Stats(in_stack_ffffffffffffff80,(string *)in_stack_ffffffffffffff78);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  in_RDI[0x10] = in_RDI + 4;
  std::vector<Catch::JunitReporter::Stats,_std::allocator<Catch::JunitReporter::Stats>_>::vector
            ((vector<Catch::JunitReporter::Stats,_std::allocator<Catch::JunitReporter::Stats>_> *)
             0x1f4b5c);
  std::
  vector<const_Catch::JunitReporter::TestCaseStats_*,_std::allocator<const_Catch::JunitReporter::TestCaseStats_*>_>
  ::vector((vector<const_Catch::JunitReporter::TestCaseStats_*,_std::allocator<const_Catch::JunitReporter::TestCaseStats_*>_>
            *)0x1f4b72);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(in_RDI + 0x17));
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(in_RDI + 0x46));
  return;
}

Assistant:

JunitReporter( ReporterConfig const& config )
        :   m_config( config ),
            m_testSuiteStats( "AllTests" ),
            m_currentStats( &m_testSuiteStats )
        {}